

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_template(chunk *c,loc_conflict centre,wchar_t rating)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  _Bool _Var7;
  uint32_t uVar8;
  uint uVar9;
  wchar_t wVar10;
  square *psVar11;
  loc_conflict lVar12;
  loc_conflict lVar13;
  loc_conflict grid_00;
  char *pcVar14;
  char *pcVar15;
  wchar_t wVar16;
  ulong uVar17;
  wchar_t wVar18;
  room_template *prVar19;
  uint32_t uVar20;
  long lVar21;
  room_template *prVar22;
  bool bVar23;
  loc_conflict grid;
  _Bool reflect;
  wchar_t txmax;
  wchar_t rotate;
  wchar_t tymax;
  loc local_c0;
  _Bool local_b5;
  wchar_t local_b4;
  ulong local_b0;
  ulong local_a8;
  char *local_a0;
  uint32_t local_94;
  int local_90;
  wchar_t local_8c;
  ulong local_88;
  loc_conflict local_80;
  wchar_t local_74;
  char *local_70;
  long local_68;
  wchar_t local_5c;
  long local_58;
  room_template *local_50;
  ulong local_48;
  bitflag *local_40;
  char *local_38;
  
  uVar20 = 1;
  prVar19 = (room_template *)0x0;
  prVar22 = room_templates;
  do {
    if ((prVar22->typ == '\x01') && ((uint)prVar22->rat == rating)) {
      uVar8 = Rand_div(uVar20);
      if (uVar8 == 0) {
        prVar19 = prVar22;
      }
      uVar20 = uVar20 + 1;
    }
    prVar22 = prVar22->next;
  } while (prVar22 != (room_template *)0x0);
  if (prVar19 == (room_template *)0x0) {
LAB_0015750f:
    _Var7 = false;
  }
  else {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,prVar19->name);
    bVar2 = prVar19->hgt;
    local_a8 = (ulong)prVar19->wid;
    bVar3 = prVar19->dor;
    local_a0 = prVar19->text;
    local_5c = (wchar_t)prVar19->tval;
    local_80 = centre;
    if (c == (chunk *)0x0) {
      __assert_fail("c",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                    ,0x480,
                    "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                   );
    }
    local_68 = CONCAT44(local_68._4_4_,c->depth);
    uVar20 = Rand_div(0x19);
    local_88 = CONCAT44(local_88._4_4_,uVar20);
    uVar20 = Rand_div((uint)bVar3);
    local_70 = (char *)CONCAT44(local_70._4_4_,uVar20);
    local_94 = Rand_div(2);
    local_b4 = (wchar_t)bVar2;
    wVar18 = (wchar_t)local_a8;
    if ((centre.y < c->height) && (centre.x < c->width)) {
      get_random_symmetry_transform
                (local_b4,wVar18,L'\0',L'\0',&local_8c,&local_b5,&local_74,&local_90);
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_74 + L'\x02',local_90 + L'\x02');
      if ((local_74 != local_b4) ||
         (bVar23 = local_90 != (int)local_a8, local_74 = local_b4, local_90 = (int)local_a8,
         wVar18 = centre.y, bVar23)) {
        __assert_fail("tymax == ymax && txmax == xmax",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                      ,0x49b,
                      "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                     );
      }
    }
    else {
      wVar10 = calc_default_transpose_weight(local_b4,wVar18);
      get_random_symmetry_transform
                ((uint)bVar2,wVar18,L'\0',wVar10,&local_8c,&local_b5,&local_74,&local_90);
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_74 + L'\x02',local_90 + L'\x02');
      _Var7 = find_space(&local_80,local_74 + L'\x02',local_90 + L'\x02');
      if (!_Var7) goto LAB_0015750f;
      centre = (loc_conflict)((ulong)local_80 & 0xffffffff);
      wVar18 = local_80.y;
    }
    local_80.x = centre.x - local_90 / 2;
    uVar17 = (ulong)(uint)local_80.x;
    local_80.y = wVar18 - local_74 / 2;
    local_48 = (ulong)(uint)local_80.y;
    if (local_b4 != L'\0') {
      local_40 = prVar19->flags;
      local_88 = CONCAT44(local_88._4_4_,(int)local_88 + 1);
      local_70 = (char *)CONCAT44(local_70._4_4_,(uint)local_70 + 0x31);
      iVar5 = (int)local_a8;
      local_58 = (ulong)(iVar5 - 1) + 1;
      wVar18 = L'\0';
      pcVar14 = local_a0;
      local_b0 = uVar17;
      local_50 = prVar19;
      do {
        if (*pcVar14 == '\0') break;
        pcVar15 = pcVar14;
        if (local_a8 != 0) {
          local_38 = pcVar14 + local_58;
          lVar21 = 0;
          do {
            local_c0 = (loc)loc((int)lVar21,wVar18);
            symmetry_transform((loc_conflict *)&local_c0,(wchar_t)local_48,(wchar_t)uVar17,local_b4,
                               (wchar_t)local_a8,local_8c,local_b5);
            if (pcVar14[lVar21] != ' ') {
              square_set_feat((chunk_conflict *)c,local_c0,FEAT_FLOOR);
              _Var7 = square_isempty((chunk_conflict *)c,local_c0);
              if (!_Var7) {
                __assert_fail("square_isempty(c, grid)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x4b2,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              bVar2 = pcVar14[lVar21];
              uVar9 = (uint)bVar2;
              wVar16 = local_c0.x;
              wVar10 = local_c0.y;
              if (bVar2 < 0x5b) {
                switch(bVar2) {
                case 0x23:
switchD_00156eae_caseD_23:
                  square_set_feat((chunk_conflict *)c,local_c0,FEAT_GRANITE);
                  uVar17 = local_b0;
                  generate_mark(c,wVar10,wVar16,wVar10,wVar16,L'\r');
                  break;
                case 0x25:
                  square_set_feat((chunk_conflict *)c,local_c0,FEAT_GRANITE);
                  uVar17 = local_b0;
                  generate_mark(c,wVar10,wVar16,wVar10,wVar16,L'\f');
                  _Var7 = flag_has_dbg(local_40,1,1,"flags","ROOMF_FEW_ENTRANCES");
                  if (_Var7) {
                    append_entrance((loc_conflict)local_c0);
                  }
                  break;
                case 0x28:
                  if (local_94 == 0) {
                    place_secret_door((chunk_conflict *)c,(loc_conflict)local_c0);
                  }
                  break;
                case 0x29:
                  if (local_94 != 0) goto LAB_00156fa2;
LAB_00156ebf:
                  square_set_feat((chunk_conflict *)c,local_c0,FEAT_GRANITE);
                  generate_mark(c,wVar10,wVar16,wVar10,wVar16,L'\r');
                  uVar17 = local_b0;
                  break;
                case 0x2b:
                  place_closed_door((chunk_conflict *)c,(loc_conflict)local_c0);
                  break;
                case 0x31:
                case 0x32:
                case 0x33:
                case 0x34:
                case 0x35:
                case 0x36:
                  if ((uint)local_70 != uVar9) goto LAB_00156ebf;
LAB_00156fa2:
                  place_secret_door((chunk_conflict *)c,(loc_conflict)local_c0);
                  uVar17 = local_b0;
                  break;
                case 0x38:
                  uVar20 = Rand_div(100);
                  if (((int)uVar20 < 0x50) || (dun->persist == true)) {
                    wVar10 = c->depth;
                    wVar16 = L'\0';
                    goto LAB_001570ee;
                  }
                  place_random_stairs((chunk_conflict *)c,(loc_conflict)local_c0);
                }
              }
              else if (bVar2 == 0x5b) {
                wVar10 = c->depth;
                wVar16 = local_5c;
LAB_001570ee:
                place_object((chunk_conflict *)c,(loc_conflict)local_c0,wVar10,false,false,'\x03',
                             wVar16);
              }
              else if (uVar9 == 0x5e) {
                uVar20 = Rand_div(4);
                if (uVar20 == 0) {
                  place_trap(c,local_c0,L'\xffffffff',c->depth);
                }
              }
              else if ((uVar9 == 0x78) && (local_94 == 0)) goto switchD_00156eae_caseD_23;
              psVar11 = square((chunk_conflict *)c,local_c0);
              flag_on_dbg(psVar11->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
              if ((int)local_68 <= (int)local_88) {
                psVar11 = square((chunk_conflict *)c,local_c0);
                flag_on_dbg(psVar11->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
              }
            }
            pcVar15 = local_38;
            if (iVar5 + -1 == (int)lVar21) goto LAB_00157151;
            lVar1 = lVar21 + 1;
            lVar6 = lVar21 + 1;
            lVar21 = lVar1;
          } while (pcVar14[lVar6] != '\0');
          pcVar15 = pcVar14 + lVar1;
        }
LAB_00157151:
        wVar18 = wVar18 + L'\x01';
        pcVar14 = pcVar15;
      } while (wVar18 != local_b4);
      local_68 = local_a8 - 1;
      local_88 = 0;
      pcVar14 = local_a0;
      prVar19 = local_50;
      wVar18 = local_b4;
      do {
        if (*pcVar14 == '\0') break;
        pcVar15 = pcVar14;
        if (local_a8 != 0) {
          local_70 = pcVar14 + local_58;
          lVar21 = 0;
          local_a0 = pcVar14;
          do {
            local_c0 = (loc)loc((int)lVar21,(int)local_88);
            symmetry_transform((loc_conflict *)&local_c0,(wchar_t)local_48,(wchar_t)uVar17,wVar18,
                               (wchar_t)local_a8,local_8c,local_b5);
            cVar4 = pcVar14[lVar21];
            if (cVar4 == '9') {
              lVar12 = loc(2,-2);
              lVar13 = loc(3,3);
              _Var7 = square_isroom((chunk_conflict *)c,local_c0);
              if ((!_Var7) || (_Var7 = square_isfloor((chunk_conflict *)c,local_c0), !_Var7)) {
                __assert_fail("square_isroom(c, grid) && square_isfloor(c, grid)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x538,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              grid_00 = loc_diff((loc_conflict)local_c0,lVar13);
              wVar18 = c->depth;
              uVar20 = Rand_div(2);
              uVar8 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,grid_00,wVar18 + uVar20,uVar8 + L'\x01');
              lVar13 = loc_sum((loc_conflict)local_c0,lVar13);
              wVar18 = c->depth;
              uVar20 = Rand_div(2);
              uVar8 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,lVar13,wVar18 + uVar20,uVar8 + L'\x01');
              uVar20 = Rand_div(2);
              if (uVar20 == 0) {
                lVar13 = loc_sum((loc_conflict)local_c0,lVar12);
                wVar18 = c->depth;
                uVar20 = Rand_div(2);
                vault_objects((chunk_conflict *)c,lVar13,wVar18,uVar20 + L'\x01');
              }
              uVar20 = Rand_div(2);
              prVar19 = local_50;
              pcVar14 = local_a0;
              wVar18 = local_b4;
              if (uVar20 == 0) {
                lVar12 = loc_diff((loc_conflict)local_c0,lVar12);
                wVar10 = c->depth;
                uVar20 = Rand_div(2);
                pcVar14 = local_a0;
                wVar18 = local_b4;
                vault_objects((chunk_conflict *)c,lVar12,wVar10,uVar20 + L'\x01');
              }
            }
            else if (cVar4 == '8') {
              _Var7 = square_isroom((chunk_conflict *)c,local_c0);
              if ((!_Var7) ||
                 ((_Var7 = square_isfloor((chunk_conflict *)c,local_c0), !_Var7 &&
                  (_Var7 = square_isstairs((chunk_conflict *)c,local_c0), !_Var7)))) {
                __assert_fail("square_isroom(c, grid) && (square_isfloor(c, grid) || square_isstairs(c, grid))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x52a,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              wVar10 = c->depth;
              uVar20 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,(loc_conflict)local_c0,wVar10 + L'\x02',
                             uVar20 + L'\x03');
              pcVar14 = local_a0;
            }
            else if (cVar4 == '#') {
              _Var7 = square_isroom((chunk_conflict *)c,local_c0);
              if ((!_Var7) || (_Var7 = square_isgranite((chunk_conflict *)c,local_c0), !_Var7)) {
LAB_00157525:
                __assert_fail("square_isroom(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x518,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              psVar11 = square((chunk_conflict *)c,local_c0);
              _Var7 = flag_has_dbg(psVar11->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
              if (!_Var7) goto LAB_00157525;
              wVar10 = count_neighbors((loc *)0x0,(chunk_conflict *)c,local_c0,square_isroom,false);
              if (wVar10 == L'\b') {
                psVar11 = square((chunk_conflict *)c,local_c0);
                flag_off(psVar11->info,3,0xd);
                psVar11 = square((chunk_conflict *)c,local_c0);
                flag_on_dbg(psVar11->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
              }
            }
            pcVar15 = local_70;
            uVar17 = local_b0;
            if ((int)local_68 == (int)lVar21) goto LAB_001574d1;
            lVar1 = lVar21 + 1;
            lVar6 = lVar21 + 1;
            lVar21 = lVar1;
          } while (pcVar14[lVar6] != '\0');
          pcVar15 = pcVar14 + lVar1;
        }
LAB_001574d1:
        wVar10 = (int)local_88 + L'\x01';
        local_88 = (ulong)(uint)wVar10;
        pcVar14 = pcVar15;
      } while (wVar10 != wVar18);
    }
    _Var7 = true;
    if ((player->opts).opt[0x18] == true) {
      msg("Room template (%s)",prVar19->name);
    }
  }
  return _Var7;
}

Assistant:

bool build_template(struct chunk *c, struct loc centre, int rating)
{
	/* All room templates currently have type 1 */
	return build_room_template_type(c, centre, 1, rating);
}